

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

void check_leaf_list_backlinks(lyd_node *node,int op)

{
  uint8_t *puVar1;
  lys_node *plVar2;
  lys_node *leaf;
  bool bVar3;
  LYS_NODE LVar4;
  ly_set *set;
  lyd_node *data;
  ulong uVar5;
  ulong uVar6;
  lyd_node *plVar7;
  
  if (2 < (uint)op) {
    __assert_fail("(op == 0) || (op == 1) || (op == 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x531,"void check_leaf_list_backlinks(struct lyd_node *, int)");
  }
  bVar3 = false;
  plVar7 = node;
  while (data = plVar7, data != (lyd_node *)0x0) {
    LVar4 = data->schema->nodetype;
    if (((LVar4 & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
       (plVar2 = data->schema->child, plVar2 != (lys_node *)0x0)) {
      for (uVar5 = 0; uVar5 < *(uint *)((long)&plVar2->name + 4); uVar5 = uVar5 + 1) {
        set = lyd_find_instance(data,*(lys_node **)(plVar2->dsc + uVar5 * 8));
        if (set == (ly_set *)0x0) {
          ly_log(node->schema->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                 ,0x54b);
          return;
        }
        for (uVar6 = 0; uVar6 < set->number; uVar6 = uVar6 + 1) {
          leaf = (set->set).s[uVar6];
          if (op == 0) {
LAB_0016040c:
            if (((ulong)leaf->child & 0x100000000) != 0) {
              *(byte *)&leaf->dsc = *(byte *)&leaf->dsc | 8;
              bVar3 = true;
              if (*(LY_DATA_TYPE *)&leaf->child == LY_TYPE_LEAFREF) goto LAB_00160429;
            }
          }
          else if ((*(LY_DATA_TYPE *)&leaf->child == LY_TYPE_LEAFREF) &&
                  ((lyd_node *)((lyd_val *)&leaf->parent)->binary == data)) {
            *(byte *)&leaf->dsc = *(byte *)&leaf->dsc | 8;
LAB_00160429:
            lyp_parse_value((lys_type *)&((lys_node *)leaf->name)[1].ref,(char **)&leaf->nodetype,
                            (lyxml_elem *)0x0,(lyd_node_leaf_list *)leaf,(lyd_attr *)0x0,
                            (lys_module *)0x0,1,*(byte *)((long)&leaf->dsc + 1) & 1,0);
            bVar3 = true;
          }
          else if (op != 1) goto LAB_0016040c;
        }
        ly_set_free(set);
      }
      LVar4 = data->schema->nodetype;
    }
    if (((LVar4 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) &&
       (plVar7 = data->child, plVar7 != (lyd_node *)0x0)) goto LAB_001604a3;
    if (data == node) break;
    do {
      plVar7 = data->next;
LAB_001604a3:
    } while ((plVar7 == (lyd_node *)0x0) && (data = data->parent, data->parent != node->parent));
  }
  if ((bVar3) && (node->parent != (lyd_node *)0x0)) {
    puVar1 = &node->parent->validity;
    *puVar1 = *puVar1 | 4;
  }
  return;
}

Assistant:

static void
check_leaf_list_backlinks(struct lyd_node *node, int op)
{
    struct lyd_node *next, *iter;
    struct lyd_node_leaf_list *leaf_list;
    struct ly_set *set, *data;
    uint32_t i, j;
    int validity_changed = 0;

    assert((op == 0) || (op == 1) || (op == 2));

    /* fix leafrefs */
    LY_TREE_DFS_BEGIN(node, next, iter) {
        /* the node is target of a leafref */
        if ((iter->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && iter->schema->child) {
            set = (struct ly_set *)iter->schema->child;
            for (i = 0; i < set->number; i++) {
                data = lyd_find_instance(iter, set->set.s[i]);
                if (data) {
                    for (j = 0; j < data->number; j++) {
                        leaf_list = (struct lyd_node_leaf_list *)data->set.d[j];
                        if (((op != 0) && (leaf_list->value_type == LY_TYPE_LEAFREF) && (leaf_list->value.leafref == iter))
                                || ((op != 1) && (leaf_list->value_flags & LY_VALUE_UNRES))) {
                            /* invalidate the leafref, a change concerning it happened */
                            leaf_list->validity |= LYD_VAL_LEAFREF;
                            validity_changed = 1;
                            if (leaf_list->value_type == LY_TYPE_LEAFREF) {
                                /* remove invalid link and put unresolved value back */
                                lyp_parse_value(&((struct lys_node_leaf *)leaf_list->schema)->type, &leaf_list->value_str,
                                                NULL, leaf_list, NULL, NULL, 1, leaf_list->dflt, 0);
                            }
                        }
                    }
                    ly_set_free(data);
                } else {
                    LOGINT(node->schema->module->ctx);
                    return;
                }
            }
        }
        LY_TREE_DFS_END(node, next, iter)
    }

    /* invalidate parent to make sure it will be checked in future validation */
    if (validity_changed && node->parent) {
        node->parent->validity |= LYD_VAL_MAND;
    }
}